

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchhandler.cpp
# Opt level: O2

void __thiscall
QEvdevTouchScreenData::QEvdevTouchScreenData
          (QEvdevTouchScreenData *this,QEvdevTouchScreenHandler *q_ptr,QStringList *args)

{
  undefined1 *puVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  qreal *pqVar5;
  QTransform *pQVar6;
  QString *arg;
  QString *s1;
  long in_FS_OFFSET;
  QStringView s;
  QStringView local_58;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->q = q_ptr;
  this->m_lastEventType = -1;
  (this->m_touchPoints).d.d = (Data *)0x0;
  (this->m_touchPoints).d.ptr = (TouchPoint *)0x0;
  (this->m_touchPoints).d.size = 0;
  (this->m_lastTouchPoints).d.d = (Data *)0x0;
  (this->m_lastTouchPoints).d.ptr = (TouchPoint *)0x0;
  (this->m_lastTouchPoints).d.size = 0;
  (this->m_contacts).d = (Data *)0x0;
  (this->m_lastContacts).d = (Data *)0x0;
  (this->m_currentData).trackingId = -1;
  (this->m_currentData).x = 0;
  (this->m_currentData).y = 0;
  (this->m_currentData).maj = -1;
  (this->m_currentData).pressure = 0;
  (this->m_currentData).state = Pressed;
  this->m_currentSlot = 0;
  this->m_timeStamp = 0.0;
  this->m_lastTimeStamp = 0.0;
  this->hw_range_x_min = 0;
  this->hw_range_x_max = 0;
  this->hw_range_y_min = 0;
  this->hw_range_y_max = 0;
  this->hw_pressure_min = 0;
  this->hw_pressure_max = 0;
  (this->hw_name).d.d = (Data *)0x0;
  (this->hw_name).d.ptr = (char16_t *)0x0;
  (this->hw_name).d.size = 0;
  (this->deviceNode).d.d = (Data *)0x0;
  (this->deviceNode).d.ptr = (char16_t *)0x0;
  *(undefined8 *)((long)&(this->deviceNode).d.ptr + 2) = 0;
  *(undefined8 *)((long)&(this->deviceNode).d.size + 2) = 0;
  pqVar5 = (qreal *)&DAT_00136e98;
  pQVar6 = &this->m_rotate;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    pQVar6->m_matrix[0][0] = *pqVar5;
    pqVar5 = pqVar5 + 1;
    pQVar6 = (QTransform *)(pQVar6->m_matrix[0] + 1);
  }
  puVar1 = &(this->m_rotate).field_0x48;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfc00;
  this->m_singleTouch = false;
  this->m_prediction = 0;
  (this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  (this->m_screenName).d.d = (Data *)0x0;
  (this->m_screenName).d.ptr = (char16_t *)0x0;
  (this->m_screenName).d.size = 0;
  (this->m_screen).wp.d = (Data *)0x0;
  *(undefined8 *)((long)&(this->m_screen).wp.d + 1) = 0;
  *(undefined8 *)((long)&(this->m_screen).wp.value + 1) = 0;
  s1 = (args->d).ptr;
  for (lVar4 = (args->d).size * 0x18; lVar4 != 0; lVar4 = lVar4 + -0x18) {
    bVar2 = comparesEqual(s1,L"force_window");
    if (bVar2) {
      this->m_forceToActiveWindow = true;
    }
    else {
      bVar2 = comparesEqual(s1,L"filtered");
      if (bVar2) {
        this->m_filtered = true;
      }
      else {
        s.m_data = L"prediction=";
        s.m_size = 0xb;
        bVar2 = QString::startsWith(s1,s,CaseSensitive);
        if (bVar2) {
          local_58.m_data = (s1->d).ptr;
          local_58.m_size = (s1->d).size;
          local_48 = QStringView::mid(&local_58,0xb,-1);
          iVar3 = QStringView::toInt(&local_48,(bool *)0x0,10);
          this->m_prediction = iVar3;
        }
      }
    }
    s1 = s1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QEvdevTouchScreenData::QEvdevTouchScreenData(QEvdevTouchScreenHandler *q_ptr, const QStringList &args)
    : q(q_ptr),
      m_lastEventType(-1),
      m_currentSlot(0),
      m_timeStamp(0), m_lastTimeStamp(0),
      hw_range_x_min(0), hw_range_x_max(0),
      hw_range_y_min(0), hw_range_y_max(0),
      hw_pressure_min(0), hw_pressure_max(0),
      m_forceToActiveWindow(false), m_typeB(false), m_singleTouch(false),
      m_filtered(false), m_prediction(0)
{
    for (const QString &arg : args) {
        if (arg == u"force_window")
            m_forceToActiveWindow = true;
        else if (arg == u"filtered")
            m_filtered = true;
        else if (const QStringView prefix = u"prediction="; arg.startsWith(prefix))
            m_prediction = QStringView(arg).mid(prefix.size()).toInt();
    }
}